

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

Result_t * __thiscall
Kumu::FileReader::Read
          (Result_t *__return_storage_ptr__,FileReader *this,byte_t *buf,ui32_t buf_len,
          ui32_t *read_count)

{
  ILogSink *this_00;
  ssize_t sVar1;
  Result_t *local_58;
  ui32_t local_38;
  ui32_t local_34;
  ui32_t tmp_int;
  i32_t tmp_count;
  ui32_t *read_count_local;
  byte_t *pbStack_20;
  ui32_t buf_len_local;
  byte_t *buf_local;
  FileReader *this_local;
  
  _tmp_int = read_count;
  read_count_local._4_4_ = buf_len;
  pbStack_20 = buf;
  buf_local = (byte_t *)this;
  this_local = (FileReader *)__return_storage_ptr__;
  if (buf == (byte_t *)0x0) {
    this_00 = DefaultLogSink();
    ILogSink::Error(this_00,"NULL pointer in file %s, line %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                    ,0x46f);
    Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_PTR);
  }
  else {
    local_34 = 0;
    local_38 = 0;
    if (read_count == (ui32_t *)0x0) {
      _tmp_int = &local_38;
    }
    *_tmp_int = 0;
    if (this->m_Handle == -1) {
      Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_FILEOPEN);
    }
    else {
      sVar1 = read(this->m_Handle,pbStack_20,(ulong)read_count_local._4_4_);
      local_34 = (ui32_t)sVar1;
      if (local_34 == 0xffffffff) {
        Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_READFAIL);
      }
      else {
        *_tmp_int = local_34;
        if (local_34 == 0) {
          local_58 = (Result_t *)RESULT_ENDOFFILE;
        }
        else {
          local_58 = (Result_t *)RESULT_OK;
        }
        Result_t::Result_t(__return_storage_ptr__,local_58);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Kumu::Result_t
Kumu::FileReader::Read(byte_t* buf, ui32_t buf_len, ui32_t* read_count) const
{
  KM_TEST_NULL_L(buf);
  i32_t  tmp_count = 0;
  ui32_t tmp_int = 0;

  if ( read_count == 0 )
    read_count = &tmp_int;

  *read_count = 0;

  if ( m_Handle == -1L )
    return RESULT_FILEOPEN;

  if ( (tmp_count = read(m_Handle, buf, buf_len)) == -1L )
    return RESULT_READFAIL;

  *read_count = tmp_count;
  return (tmp_count == 0 ? RESULT_ENDOFFILE : RESULT_OK);
}